

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

int * __thiscall
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>::findNode
          (Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
           *this,BSTNode *t,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key)

{
  int iVar1;
  long lVar2;
  
  if (t != (BSTNode *)0x0) {
    do {
      iVar1 = (*this->cmpp->_vptr_Comparator[2])(this->cmpp,key,t);
      lVar2 = 0x28;
      if ((char)iVar1 == '\0') {
        iVar1 = (*this->cmpp->_vptr_Comparator[2])(this->cmpp,t,key);
        lVar2 = 0x30;
        if ((char)iVar1 == '\0') {
          return &t->value;
        }
      }
      t = *(BSTNode **)((long)&(t->key)._M_dataplus._M_p + lVar2);
    } while (t != (BSTNode *)0x0);
  }
  return (int *)0x0;
}

Assistant:

ValueType *findNode(BSTNode *t, const KeyType & key) const {
      if (t == NULL)  return NULL;
      int sign = compareKeys(key, t->key);
      if (sign == 0) return &t->value;
      if (sign < 0) {
         return findNode(t->left, key);
      } else {
         return findNode(t->right, key);
      }
   }